

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Azure.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Azure::Secrets::readConfiguration_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Secrets *this)

{
  Client *client;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Url local_38;
  Secrets *local_18;
  Secrets *this_local;
  
  client = *(Client **)this;
  local_18 = this;
  this_local = (Secrets *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"config",&local_79);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_58,&local_78);
  getUrl(&local_38,this,&local_58);
  HttpConsumer::get(__return_storage_ptr__,client,&local_38);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_38);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Azure::Secrets::readConfiguration() {
  return Vault::HttpConsumer::get(client_, getUrl(Path{"config"}));
}